

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void sga_pack_unpack(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi,Integer *icount
                    ,Integer pack)

{
  float *pfVar1;
  logical lVar2;
  long lVar3;
  double *pdVar4;
  long in_RCX;
  Integer in_RSI;
  Integer in_RDI;
  long in_R8;
  long *in_R9;
  long in_stack_00000008;
  Integer src_hi;
  Integer src_lo;
  void *dst;
  Integer dst_hi;
  Integer dst_lo;
  void *src;
  void *msk;
  void *buf;
  Integer ignore;
  DoubleComplex *aptr_6;
  SingleComplex *aptr_5;
  double *aptr_4;
  float *aptr_3;
  longlong *aptr_2;
  long *aptr_1;
  int *aptr;
  Integer ONE;
  Integer elems;
  Integer lop_1;
  Integer type_msk;
  Integer type_dst;
  Integer type_src;
  Integer ndim_msk;
  Integer ndim_dst;
  Integer ndim_src;
  Integer dims;
  Integer hip;
  Integer lop;
  Integer first;
  Integer np;
  Integer myplace;
  Integer i;
  Integer me;
  Integer nproc;
  long *lim;
  void *ptr;
  Integer *in_stack_000001a8;
  Integer *in_stack_000001b0;
  Integer in_stack_000001b8;
  Integer in_stack_000001c0;
  Integer *in_stack_00000280;
  void *in_stack_00000288;
  Integer *in_stack_00000290;
  Integer *in_stack_00000298;
  Integer in_stack_000002a0;
  Integer in_stack_000002b0;
  Integer in_stack_000002b8;
  void *in_stack_00000300;
  Integer in_stack_00000308;
  Integer in_stack_00000310;
  Integer in_stack_00000318;
  long in_stack_00000320;
  Integer in_stack_00000328;
  void *in_stack_00000338;
  void *in_stack_00000340;
  Integer *in_stack_00000380;
  Integer *in_stack_00000388;
  Integer *in_stack_00000390;
  Integer in_stack_00000398;
  char *in_stack_fffffffffffffea0;
  Integer *ld;
  char *in_stack_fffffffffffffea8;
  Integer *in_stack_fffffffffffffeb0;
  Integer *in_stack_fffffffffffffeb8;
  Integer in_stack_fffffffffffffec0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  Integer local_50;
  Integer local_48;
  void *local_40;
  long local_38;
  long *local_30;
  long local_28;
  long local_20;
  Integer local_10;
  Integer local_8;
  
  local_40 = (void *)0x0;
  local_68 = 0;
  local_70 = -1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_48 = pnga_nnodes();
  local_50 = pnga_nodeid();
  pnga_check_handle(elems,(char *)ONE);
  pnga_check_handle(elems,(char *)ONE);
  pnga_check_handle(elems,(char *)ONE);
  pnga_inquire(type_src,(Integer *)type_dst,(Integer *)type_msk,(Integer *)lop_1);
  pnga_inquire(type_src,(Integer *)type_dst,(Integer *)type_msk,(Integer *)lop_1);
  pnga_inquire(type_src,(Integer *)type_dst,(Integer *)type_msk,(Integer *)lop_1);
  if (local_90 != 1) {
    pnga_error((char *)src,dst_lo);
  }
  if (local_98 != 1) {
    pnga_error((char *)src,dst_lo);
  }
  if (local_a0 != 1) {
    pnga_error((char *)src,dst_lo);
  }
  if (local_a8 != local_b0) {
    pnga_error((char *)src,dst_lo);
  }
  if (in_stack_00000008 == 1) {
    lVar2 = pnga_compare_distr(in_stack_000002b8,in_stack_000002b0);
    if (lVar2 == 0) {
      pnga_error((char *)src,dst_lo);
    }
  }
  else if (in_stack_00000008 == 0) {
    lVar2 = pnga_compare_distr(in_stack_000002b8,in_stack_000002b0);
    if (lVar2 == 0) {
      pnga_error((char *)src,dst_lo);
    }
  }
  else {
    pnga_error((char *)src,dst_lo);
  }
  pnga_sync();
  local_40 = pnga_malloc((Integer)in_stack_fffffffffffffeb0,
                         (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
  memset(local_40,0,local_48 << 3);
  pnga_distribution(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
  if (0 < local_78) {
    if (local_78 < local_20) {
      local_78 = local_20;
    }
    if (local_28 < local_80) {
      local_80 = local_28;
    }
    if ((local_78 <= local_28) && (local_20 <= local_80)) {
      pnga_locate_nnodes(in_stack_00000398,in_stack_00000390,in_stack_00000388,in_stack_00000380);
      pnga_access_ptr(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                      in_stack_00000280);
      lVar3 = (local_80 - local_78) + 1;
      in_stack_fffffffffffffea8 = (char *)(local_b8 + -0x3e9);
      switch(in_stack_fffffffffffffea8) {
      case (char *)0x0:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          if (*(int *)(local_38 + local_58 * 4) != 0) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0x1:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          if (*(long *)(local_38 + local_58 * 8) != 0) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0x2:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          pfVar1 = (float *)(local_38 + local_58 * 4);
          if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0x3:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          pdVar4 = (double *)(local_38 + local_58 * 8);
          if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0x5:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          pfVar1 = (float *)(local_38 + local_58 * 8);
          if (((*pfVar1 != 0.0) || (NAN(*pfVar1))) ||
             ((pfVar1 = (float *)(local_38 + 4 + local_58 * 8), *pfVar1 != 0.0 || (NAN(*pfVar1)))))
          {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0x6:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          pdVar4 = (double *)(local_38 + local_58 * 0x10);
          if ((((*pdVar4 != 0.0) || (NAN(*pdVar4))) ||
              (pdVar4 = (double *)(local_38 + local_58 * 0x10 + 8), *pdVar4 != 0.0)) ||
             (NAN(*pdVar4))) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
        break;
      case (char *)0xf:
        for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
          if (*(long *)(local_38 + local_58 * 8) != 0) {
            if (local_70 < 0) {
              local_70 = local_58;
            }
            *(long *)((long)local_40 + local_68 * 8) = *(long *)((long)local_40 + local_68 * 8) + 1;
          }
        }
      }
    }
  }
  pnga_gop(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(Integer)in_stack_fffffffffffffeb0,
           in_stack_fffffffffffffea8);
  *local_30 = 0;
  local_60 = 0;
  for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
    if (local_58 < local_68) {
      local_60 = *(long *)((long)local_40 + local_58 * 8) + local_60;
    }
    *local_30 = *(long *)((long)local_40 + local_58 * 8) + *local_30;
  }
  if (((local_78 <= local_28) && (local_20 <= local_80)) &&
     (*(long *)((long)local_40 + local_68 * 8) != 0)) {
    pnga_malloc((Integer)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                in_stack_fffffffffffffea0);
    pnga_access_ptr(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                    in_stack_00000280);
    if (in_stack_00000008 == 1) {
      pnga_access_ptr(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                      in_stack_00000280);
      ld = (Integer *)0x0;
      sga_pack(in_stack_00000328,in_stack_00000320,in_stack_00000318,in_stack_00000310,
               in_stack_00000308,in_stack_00000300,in_stack_00000338,in_stack_00000340);
      pnga_put(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,ld);
      pnga_release(local_8,&local_78,&local_80);
    }
    else if (in_stack_00000008 == 0) {
      pnga_access_ptr(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                      in_stack_00000280);
      pnga_get((Integer)aptr_4,(Integer *)aptr_5,(Integer *)aptr_6,(void *)ignore,(Integer *)buf);
      sga_unpack(in_stack_00000328,in_stack_00000320,in_stack_00000318,in_stack_00000310,
                 in_stack_00000308,in_stack_00000300,in_stack_00000338,in_stack_00000340);
      pnga_release_update(local_10,&local_78,&local_80);
    }
    pnga_free((void *)0x1818c3);
  }
  pnga_free((void *)0x1818d0);
  pnga_sync();
  return;
}

Assistant:

static void sga_pack_unpack(Integer g_src, Integer g_dst, Integer g_msk,
                            Integer lo, Integer hi, Integer* icount,
                            Integer pack)
{
    void *ptr;
    long *lim=NULL;
    Integer nproc, me, i, myplace, np=0, first=-1;
    Integer lop, hip, dims;
    Integer ndim_src, ndim_dst, ndim_msk;
    Integer type_src, type_dst, type_msk;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_pack src");
    pnga_check_handle(g_dst, "ga_pack dst");
    pnga_check_handle(g_msk, "ga_pack msk");
    pnga_inquire(g_src, &type_src, &ndim_src, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim_dst, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim_msk, &dims);
    if (1 != ndim_src) {
        pnga_error("ga_pack: supports 1-dim arrays only: src", ndim_src);
    }
    if (1 != ndim_dst) {
        pnga_error("ga_pack: supports 1-dim arrays only: dst", ndim_dst);
    }
    if (1 != ndim_msk) {
        pnga_error("ga_pack: supports 1-dim arrays only: msk", ndim_msk);
    }
    if (type_src != type_dst) {
        pnga_error("ga_pack: src and dst must be same type", 0);
    }
    if (1 == pack) {
        if(!pnga_compare_distr(g_src, g_msk)) {
            pnga_error("ga_pack: src and msk distributions differ",0);
        }
    } else if (0 == pack) {
        if(!pnga_compare_distr(g_dst, g_msk)) {
            pnga_error("ga_unpack: dst and msk distributions differ",0);
        }
    } else {
        pnga_error("ga_pack/unpack bad pack flag",0);
    }

    pnga_sync();

    lim = (long*) pnga_malloc(nproc, MT_C_LONGINT, "ga_pack lim buf");
    bzero(lim,sizeof(long)*nproc);
    pnga_distribution(g_msk, me, &lop, &hip);

    /* how many elements do we have to copy? */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */
        Integer lop_1 = lop-1;
        /* adjust the range of elements to be within <lo,hi> */
        if(lop < lo) lop = lo;
        if(hip > hi) hip = hi;
        if(hi <lop || hip <lo); /* we have no elements to update */
        else{
            Integer elems, ONE=1;
            pnga_locate_nnodes(g_msk, &ONE, &lop_1, &np);
            pnga_access_ptr(g_msk, &lop, &hip, &ptr, &elems);
            elems = hip-lop+1;
            switch (type_msk) {
#define TYPE_CASE(MT,T,AT) case MT:                                         \
                {                                                           \
                    T * restrict aptr = (T*)ptr;                            \
                    for (i=0; i<elems; i++) {                               \
                        if (neq_zero_##AT(aptr[i])) {                       \
                            if (first<0) first=i;                           \
                            lim[np]++;                                      \
                        }                                                   \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            }
        }
    }

    /* find number of elements everybody else is contributing */
    pnga_gop(C_LONG,lim,nproc,"+");

    for(i= myplace= *icount= 0; i<nproc; i++){
        if(i<np) myplace += lim[i];
        *icount += lim[i];
    }

    if(hi<lop || hip<lo || lim[np]==0 ); /* we have no elements to update */
    else{
        Integer ignore;
        void *buf=NULL, *msk=NULL;
        buf = pnga_malloc(lim[np], type_dst, "ga pack buf");
        pnga_access_ptr(g_msk, &lop, &hip, &msk, &ignore);
        if (1 == pack) {
            void *src=NULL;
            Integer dst_lo=myplace+1, dst_hi=myplace+lim[np];
            pnga_access_ptr(g_src, &lop, &hip, &src, &ignore);
            sga_pack(first, lim[np], hip-lop+1,
                     type_src, type_msk, src, buf, msk);
            pnga_put(g_dst, &dst_lo, &dst_hi, buf, &ignore);
            pnga_release(g_src, &lop, &hip);
        } else if (0 == pack) {
            void *dst=NULL;
            Integer src_lo=myplace+1, src_hi=myplace+lim[np];
            pnga_access_ptr(g_dst, &lop, &hip, &dst, &ignore);
            pnga_get(g_src, &src_lo, &src_hi, buf, &ignore);
            sga_unpack(first, lim[np], hip-lop+1,
                       type_src, type_msk, buf, dst, msk);
            pnga_release_update(g_dst, &lop, &hip);
        }
        pnga_free(buf);
    }
    pnga_free(lim);
    pnga_sync();
}